

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O0

int checkerBig2(void)

{
  int iVar1;
  char *pcVar2;
  int local_38;
  int local_34;
  int d3;
  int d2;
  int d1;
  int d;
  char *message;
  FILE *pFStack_18;
  int i;
  FILE *out;
  
  pFStack_18 = fopen("out.txt","r");
  _d1 = "PASSED";
  if (pFStack_18 == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
  }
  else {
    message._4_4_ = 1;
    while( true ) {
      if ((5000 < message._4_4_) || (_d1 = ScanInt((FILE *)pFStack_18,&d2), _d1 != "PASSED"))
      goto LAB_00103f52;
      if ((message._4_4_ != 1) && (((message._4_4_ != 2 && (message._4_4_ != 0x7c1)) && (d2 != 2))))
      break;
      if ((message._4_4_ == 1) && (d2 != 0)) {
        printf("wrong output -- ");
        _d1 = "FAILED";
        goto LAB_00103f52;
      }
      if ((message._4_4_ == 2) && (d2 != 2)) {
        printf("wrong output -- ");
        _d1 = "FAILED";
        goto LAB_00103f52;
      }
      if ((message._4_4_ == 0x7c1) && (d2 != 1)) {
        printf("wrong output -- ");
        _d1 = "FAILED";
        goto LAB_00103f52;
      }
      message._4_4_ = message._4_4_ + 1;
    }
    printf("wrong output -- ");
    _d1 = "FAILED";
LAB_00103f52:
    if (_d1 == "PASSED") {
      pcVar2 = ScanIntInt((FILE *)pFStack_18,&d3,&local_34);
      if ((pcVar2 == "PASSED") &&
         (pcVar2 = ScanInt((FILE *)pFStack_18,&local_38), pcVar2 == "PASSED")) {
        if (((d3 != 2) || (local_34 != 0x7c1)) || (local_38 != 1)) {
          printf("wrong output -- ");
          _d1 = "FAILED";
        }
      }
      else {
        _d1 = "FAILED";
      }
    }
    if ((_d1 == "PASSED") && (iVar1 = HaveGarbageAtTheEnd((FILE *)pFStack_18), iVar1 != 0)) {
      _d1 = "FAILED";
    }
    fclose(pFStack_18);
    printf("%s\n",_d1);
    out._4_4_ = (uint)(_d1 == "FAILED");
  }
  testN = testN + 1;
  return out._4_4_;
}

Assistant:

static int checkerBig2(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 1; i <= 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if (i != 1 && i != 2 && i != 1985 && d != 2) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 1 && d != 0) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 2 && d != 2) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 1985 && d != 1) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        int d1, d2, d3;
        if (ScanIntInt(out, &d1, &d2) != Pass || ScanInt(out, &d3) != Pass) {
            message = Fail;
        } else if (d1 != 2 || d2 != 1985 || d3 != 1) {
            printf("wrong output -- ");
            message = Fail;
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}